

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fix-qdf.cc
# Opt level: O2

void __thiscall QdfFixer::adjustOstreamXref(QdfFixer *this)

{
  int iVar1;
  pointer pQVar2;
  int iVar3;
  size_t local_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined4 local_20;
  
  iVar1 = this->ostream_id;
  local_38 = this->ostream_idx;
  this->ostream_idx = local_38 + 1;
  iVar3 = QIntC::IntConverter<unsigned_long,_int,_false,_true>::convert(&local_38);
  QPDFXRefEntry::QPDFXRefEntry((QPDFXRefEntry *)&local_30,2,(long)iVar1,iVar3);
  pQVar2 = (this->xref).super__Vector_base<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_>._M_impl.
           super__Vector_impl_data._M_finish;
  *(undefined4 *)(pQVar2 + -8) = local_20;
  *(undefined8 *)(pQVar2 + -0x18) = local_30;
  *(undefined8 *)(pQVar2 + -0x10) = uStack_28;
  return;
}

Assistant:

void
QdfFixer::adjustOstreamXref()
{
    xref.back() = QPDFXRefEntry(2, ostream_id, QIntC::to_int(ostream_idx++));
}